

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O3

int main(void)

{
  string filename;
  YAJLImage image;
  bitio_stream bstream;
  long *local_138;
  long local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  YAJLImage local_d8;
  bitio_stream local_78;
  
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"/home/supercmmetry/Pictures/supercmmetry.jpg","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_138,local_130 + (long)local_138);
  bitio::bitio_stream::bitio_stream(&local_78,&local_f8,READ,0x400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  YAJLImage::YAJLImage(&local_d8,false);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_138,local_130 + (long)local_138);
  YAJLImage::set_src(&local_d8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  YAJLImage::scan_markers(&local_d8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::vector<YAJLFrame,_std::allocator<YAJLFrame>_>::~vector
            (&local_d8.super_YAJLImageDescriptor.frames);
  if (local_d8.super_YAJLImageDescriptor.misc.comments.
      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_d8.super_YAJLImageDescriptor.misc.comments.
                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super_YAJLImageDescriptor.misc.comments.
                          super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super_YAJLImageDescriptor.misc.comments.
                          super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.super_YAJLImageDescriptor.misc.app_data.
      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_d8.super_YAJLImageDescriptor.misc.app_data.
                    super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super_YAJLImageDescriptor.misc.app_data.
                          super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super_YAJLImageDescriptor.misc.app_data.
                          super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.filename._M_dataplus._M_p != &local_78.filename.field_2) {
    operator_delete(local_78.filename._M_dataplus._M_p,
                    local_78.filename.field_2._M_allocated_capacity + 1);
  }
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    std::string filename = "/home/supercmmetry/Pictures/supercmmetry.jpg";
    bitio::bitio_stream bstream(filename, bitio::READ);

    YAJLImage image(false);
    image.set_src(filename);
    image.scan_markers();
    std::cout << std::endl;
    return 0;
}